

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void atomic(global_State *g,lua_State *L)

{
  size_t sVar1;
  size_t sVar2;
  global_State *in_RSI;
  GCobj *in_RDI;
  size_t udsize;
  
  gc_mark_uv(in_RSI);
  gc_propagate_gray(in_RSI);
  (in_RDI->th).stacksize = in_RDI[1].gch.nextgc.gcptr32;
  in_RDI[1].gch.nextgc.gcptr32 = 0;
  if (((ulong)in_RSI->strhash & 0x300000000) != 0) {
    gc_mark((global_State *)udsize,in_RDI);
  }
  gc_traverse_trace((global_State *)udsize,(GCtrace *)&in_RDI->gch);
  gc_mark_gcroot(in_RSI);
  gc_propagate_gray(in_RSI);
  (in_RDI->th).stacksize = (in_RDI->pt).varinfo.ptr32;
  (in_RDI->pt).varinfo.ptr32 = 0;
  gc_propagate_gray(in_RSI);
  sVar1 = lj_gc_separateudata(g,L._4_4_);
  gc_mark_mmudata(in_RSI);
  sVar2 = gc_propagate_gray(in_RSI);
  gc_clearweak((GCobj *)g);
  *(byte *)&(in_RDI->th).openupval.gcptr32 = (byte)(in_RDI->th).openupval.gcptr32 ^ 3;
  *(char *)((long)in_RDI + 0x84) = (char)(in_RDI->th).openupval.gcptr32;
  (in_RDI->pt).lineinfo.ptr32 = (int)in_RDI + 0x30;
  *(MSize *)((long)in_RDI + 0x50) = (in_RDI->pt).sizept - ((int)sVar2 + (int)sVar1);
  return;
}

Assistant:

static void atomic(global_State *g, lua_State *L)
{
  size_t udsize;

  gc_mark_uv(g);  /* Need to remark open upvalues (the thread may be dead). */
  gc_propagate_gray(g);  /* Propagate any left-overs. */

  setgcrefr(g->gc.gray, g->gc.weak);  /* Empty the list of weak tables. */
  setgcrefnull(g->gc.weak);
  lua_assert(!iswhite(obj2gco(mainthread(g))));
  gc_markobj(g, L);  /* Mark running thread. */
  gc_traverse_curtrace(g);  /* Traverse current trace. */
  gc_mark_gcroot(g);  /* Mark GC roots (again). */
  gc_propagate_gray(g);  /* Propagate all of the above. */

  setgcrefr(g->gc.gray, g->gc.grayagain);  /* Empty the 2nd chance list. */
  setgcrefnull(g->gc.grayagain);
  gc_propagate_gray(g);  /* Propagate it. */

  udsize = lj_gc_separateudata(g, 0);  /* Separate userdata to be finalized. */
  gc_mark_mmudata(g);  /* Mark them. */
  udsize += gc_propagate_gray(g);  /* And propagate the marks. */

  /* All marking done, clear weak tables. */
  gc_clearweak(gcref(g->gc.weak));

  /* Prepare for sweep phase. */
  g->gc.currentwhite = (uint8_t)otherwhite(g);  /* Flip current white. */
  g->strempty.marked = g->gc.currentwhite;
  setmref(g->gc.sweep, &g->gc.root);
  g->gc.estimate = g->gc.total - (MSize)udsize;  /* Initial estimate. */
}